

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
vkt::pipeline::anon_unknown_0::generateVertices
          (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
           *__return_storage_ptr__,GeometryType geometryType)

{
  allocator<vkt::pipeline::Vertex4RGBA> *paVar1;
  float *pfVar2;
  allocator<vkt::pipeline::Vertex4RGBA> local_201;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_200;
  int local_1e4;
  int local_1e0;
  int i_3;
  int i_2;
  int i_1;
  Vertex4RGBA vertexData_2 [4];
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_150;
  undefined1 local_134 [8];
  Vertex4RGBA vertex;
  undefined1 local_f8 [8];
  Vertex4RGBA vertexData_1 [2];
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_b0;
  Vector<float,_4> local_98;
  int local_88;
  int i;
  undefined1 local_78 [8];
  Vertex4RGBA vertexData [3];
  GeometryType geometryType_local;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices;
  
  vertexData[2].color.m_data[2]._3_1_ = 0;
  vertexData[2].color.m_data[3] = (float)geometryType;
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            (__return_storage_ptr__);
  switch(vertexData[2].color.m_data[3]) {
  case 0.0:
  case 8.40779e-45:
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_78,-0.75,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData[0].position.m_data + 2),1.0,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData[0].color.m_data + 2),0.75,0.125,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData[1].position.m_data + 2),1.0,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData[1].color.m_data + 2),0.75,-0.125,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData[2].position.m_data + 2),1.0,0.0,0.0,1.0);
    if (vertexData[2].color.m_data[3] == 8.40779e-45) {
      for (local_88 = 0; local_88 < 3; local_88 = local_88 + 1) {
        tcu::Vector<float,_4>::Vector(&local_98);
        *(undefined8 *)(vertexData[local_88].position.m_data + 2) = local_98.m_data._0_8_;
        *(undefined8 *)vertexData[local_88].color.m_data = local_98.m_data._8_8_;
      }
    }
    paVar1 = (allocator<vkt::pipeline::Vertex4RGBA> *)((long)vertexData_1[1].color.m_data + 0xf);
    std::allocator<vkt::pipeline::Vertex4RGBA>::allocator(paVar1);
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<vkt::pipeline::Vertex4RGBA*,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &local_b0,(Vertex4RGBA *)local_78,(Vertex4RGBA *)(vertexData[2].color.m_data + 2),
               paVar1);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
              (__return_storage_ptr__,&local_b0);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
              (&local_b0);
    std::allocator<vkt::pipeline::Vertex4RGBA>::~allocator
              ((allocator<vkt::pipeline::Vertex4RGBA> *)((long)vertexData_1[1].color.m_data + 0xf));
    break;
  case 1.4013e-45:
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_f8,-0.75,0.25,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData_1[0].position.m_data + 2),1.0,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData_1[0].color.m_data + 2),0.75,-0.25,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData_1[1].position.m_data + 2),1.0,0.0,0.0,1.0);
    paVar1 = (allocator<vkt::pipeline::Vertex4RGBA> *)((long)vertex.color.m_data + 0xb);
    std::allocator<vkt::pipeline::Vertex4RGBA>::allocator(paVar1);
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<vkt::pipeline::Vertex4RGBA_const*,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               (vertex.color.m_data + 3),(Vertex4RGBA *)local_f8,
               (Vertex4RGBA *)(vertexData_1[1].color.m_data + 2),paVar1);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
              (__return_storage_ptr__,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               (vertex.color.m_data + 3));
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
              ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               (vertex.color.m_data + 3));
    std::allocator<vkt::pipeline::Vertex4RGBA>::~allocator
              ((allocator<vkt::pipeline::Vertex4RGBA> *)((long)vertex.color.m_data + 0xb));
    break;
  case 2.8026e-45:
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_134,0.0,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertex.position.m_data + 2),1.0,0.0,0.0,1.0);
    paVar1 = (allocator<vkt::pipeline::Vertex4RGBA> *)((long)vertexData_2[3].color.m_data + 0xf);
    std::allocator<vkt::pipeline::Vertex4RGBA>::allocator(paVar1);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
              (&local_150,1,(value_type *)local_134,paVar1);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
              (__return_storage_ptr__,&local_150);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
              (&local_150);
    std::allocator<vkt::pipeline::Vertex4RGBA>::~allocator
              ((allocator<vkt::pipeline::Vertex4RGBA> *)((long)vertexData_2[3].color.m_data + 0xf));
    break;
  case 4.2039e-45:
  case 5.60519e-45:
  case 7.00649e-45:
  case 9.80909e-45:
  case 1.12104e-44:
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&i_2,-1.0,-1.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData_2[0].position.m_data + 2),1.0,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData_2[0].color.m_data + 2),1.0,-1.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData_2[1].position.m_data + 2),1.0,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData_2[1].color.m_data + 2),-1.0,1.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData_2[2].position.m_data + 2),1.0,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData_2[2].color.m_data + 2),1.0,1.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(vertexData_2[3].position.m_data + 2),1.0,0.0,0.0,1.0);
    if (vertexData[2].color.m_data[3] == 7.00649e-45) {
      for (i_3 = 0; i_3 < 4; i_3 = i_3 + 1) {
        pfVar2 = tcu::Vector<float,_4>::w
                           ((Vector<float,_4> *)(vertexData_2[i_3].position.m_data + 2));
        *pfVar2 = 0.25;
      }
    }
    else if (vertexData[2].color.m_data[3] == 9.80909e-45) {
      for (local_1e0 = 0; local_1e0 < 4; local_1e0 = local_1e0 + 1) {
        pfVar2 = tcu::Vector<float,_4>::w
                           ((Vector<float,_4> *)(vertexData_2[local_1e0].position.m_data + 2));
        *pfVar2 = 0.0;
      }
    }
    else if (vertexData[2].color.m_data[3] == 1.12104e-44) {
      pfVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(vertexData_2[0].position.m_data + 2));
      *pfVar2 = 0.0;
      pfVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(vertexData_2[2].position.m_data + 2));
      *pfVar2 = 0.0;
    }
    else if (vertexData[2].color.m_data[3] == 5.60519e-45) {
      for (local_1e4 = 0; local_1e4 < 4; local_1e4 = local_1e4 + 1) {
        pfVar2 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(&i_2 + (long)local_1e4 * 8));
        *pfVar2 = 0.5;
      }
    }
    std::allocator<vkt::pipeline::Vertex4RGBA>::allocator(&local_201);
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<vkt::pipeline::Vertex4RGBA*,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &local_200,(Vertex4RGBA *)&i_2,(Vertex4RGBA *)(vertexData_2[3].color.m_data + 2),
               &local_201);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
              (__return_storage_ptr__,&local_200);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
              (&local_200);
    std::allocator<vkt::pipeline::Vertex4RGBA>::~allocator(&local_201);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4RGBA> generateVertices (const GeometryType geometryType)
{
	std::vector<Vertex4RGBA> vertices;

	switch (geometryType)
	{
		case GEOMETRY_TYPE_OPAQUE_TRIANGLE:
		case GEOMETRY_TYPE_INVISIBLE_TRIANGLE:
		{
			Vertex4RGBA vertexData[3] =
			{
				{
					tcu::Vec4(-0.75f, 0.0f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				},
				{
					tcu::Vec4(0.75f, 0.125f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				},
				{
					tcu::Vec4(0.75f, -0.125f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				}
			};

			if (geometryType == GEOMETRY_TYPE_INVISIBLE_TRIANGLE)
			{
				for (int i = 0; i < 3; i++)
					vertexData[i].color = tcu::Vec4();
			}

			vertices = std::vector<Vertex4RGBA>(vertexData, vertexData + 3);
			break;
		}

		case GEOMETRY_TYPE_OPAQUE_LINE:
		{
			const Vertex4RGBA vertexData[2] =
			{
				{
					tcu::Vec4(-0.75f, 0.25f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				},
				{
					tcu::Vec4(0.75f, -0.25f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				}
			};

			vertices = std::vector<Vertex4RGBA>(vertexData, vertexData + 2);
			break;
		}

		case GEOMETRY_TYPE_OPAQUE_POINT:
		{
			const Vertex4RGBA vertex =
			{
				tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
				tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
			};

			vertices = std::vector<Vertex4RGBA>(1, vertex);
			break;
		}

		case GEOMETRY_TYPE_OPAQUE_QUAD:
		case GEOMETRY_TYPE_OPAQUE_QUAD_NONZERO_DEPTH:
		case GEOMETRY_TYPE_TRANSLUCENT_QUAD:
		case GEOMETRY_TYPE_INVISIBLE_QUAD:
		case GEOMETRY_TYPE_GRADIENT_QUAD:
		{
			Vertex4RGBA vertexData[4] =
			{
				{
					tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				},
				{
					tcu::Vec4(1.0f, -1.0f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				},
				{
					tcu::Vec4(-1.0f, 1.0f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				},
				{
					tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				}
			};

			if (geometryType == GEOMETRY_TYPE_TRANSLUCENT_QUAD)
			{
				for (int i = 0; i < 4; i++)
					vertexData[i].color.w() = 0.25f;
			}
			else if (geometryType == GEOMETRY_TYPE_INVISIBLE_QUAD)
			{
				for (int i = 0; i < 4; i++)
					vertexData[i].color.w() = 0.0f;
			}
			else if (geometryType == GEOMETRY_TYPE_GRADIENT_QUAD)
			{
				vertexData[0].color.w() = 0.0f;
				vertexData[2].color.w() = 0.0f;
			}
			else if (geometryType == GEOMETRY_TYPE_OPAQUE_QUAD_NONZERO_DEPTH)
			{
				for (int i = 0; i < 4; i++)
					vertexData[i].position.z() = 0.5f;
			}

			vertices = std::vector<Vertex4RGBA>(vertexData, vertexData + 4);
			break;
		}

		default:
			DE_ASSERT(false);
	}
	return vertices;
}